

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int dump_siblings(lyout *out,lyxml_elem *e,int options)

{
  lyxml_elem *plVar1;
  int iVar2;
  bool bVar3;
  int local_3c;
  int ret;
  lyxml_elem *next;
  lyxml_elem *iter;
  lyxml_elem *start;
  int options_local;
  lyxml_elem *e_local;
  lyout *out_local;
  
  local_3c = 0;
  iter = e;
  if (e->parent == (lyxml_elem *)0x0) {
    while( true ) {
      bVar3 = false;
      if (iter->prev != (lyxml_elem *)0x0) {
        bVar3 = iter->prev->next != (lyxml_elem *)0x0;
      }
      if (!bVar3) break;
      iter = iter->prev;
    }
  }
  else {
    iter = e->parent->child;
  }
  next = iter;
  while (next != (lyxml_elem *)0x0) {
    plVar1 = next->next;
    iVar2 = dump_elem(out,next,0,options,(uint)(plVar1 == (lyxml_elem *)0x0));
    local_3c = iVar2 + local_3c;
    next = plVar1;
  }
  return local_3c;
}

Assistant:

static int
dump_siblings(struct lyout *out, const struct lyxml_elem *e, int options)
{
    const struct lyxml_elem *start, *iter, *next;
    int ret = 0;

    if (e->parent) {
        start = e->parent->child;
    } else {
        start = e;
        while(start->prev && start->prev->next) {
            start = start->prev;
        }
    }

    LY_TREE_FOR_SAFE(start, next, iter) {
        ret += dump_elem(out, iter, 0, options, (next ? 0 : 1));
    }

    return ret;
}